

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O0

void nhr_response_read_chunks(nhr_response r,char *str)

{
  int iVar1;
  ushort **ppuVar2;
  bool bVar3;
  uint local_1c;
  char *pcStack_18;
  uint chunk_len;
  char *str_local;
  nhr_response r_local;
  
  pcStack_18 = str;
  str_local = (char *)r;
  while( true ) {
    local_1c = 0;
    iVar1 = __isoc99_sscanf(pcStack_18,"%X",&local_1c);
    bVar3 = true;
    if (iVar1 != 1) {
      iVar1 = __isoc99_sscanf(pcStack_18,"%x",&local_1c);
      bVar3 = iVar1 == 1;
    }
    if (!bVar3) {
      return;
    }
    while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*pcStack_18] & 0x1000) != 0) {
      pcStack_18 = pcStack_18 + 1;
    }
    if (local_1c == 0) break;
    pcStack_18 = pcStack_18 + 2;
    nhr_response_add_body_data((nhr_response)str_local,pcStack_18,(ulong)local_1c);
    pcStack_18 = pcStack_18 + (ulong)local_1c + 2;
  }
  iVar1 = strncmp(pcStack_18,k_nhr_double_CRLF,4);
  if (iVar1 == 0) {
    str_local[0x24] = '\x01';
  }
  return;
}

Assistant:

void nhr_response_read_chunks(nhr_response r, char * str) {
	unsigned int chunk_len = 0;
	while ((nhr_sscanf(str, "%X", &chunk_len) == 1) || (nhr_sscanf(str, "%x", &chunk_len) == 1)) {
		while (isxdigit(*str)) str++;
		if (chunk_len == 0) {
			if (strncmp(str, k_nhr_double_CRLF, k_nhr_double_CRLF_length) == 0) {
				r->is_all_chunks_processed = nhr_true;
			}
			break;
		}
		str += k_nhr_CRLF_length;
		nhr_response_add_body_data(r, str, chunk_len);
		str += chunk_len;
		str += k_nhr_CRLF_length;
		chunk_len = 0;
	}
}